

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O3

void busy_msleep(unsigned_long msec)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  unsigned_long j;
  timeval local_40;
  
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var2 = local_40.tv_usec;
  _Var1 = local_40.tv_sec;
  do {
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  } while ((ulong)((local_40.tv_usec - _Var2) / 1000 + (local_40.tv_sec - _Var1) * 1000) < msec);
  return;
}

Assistant:

static void busy_msleep( unsigned long msec )
{
    struct mbedtls_timing_hr_time hires;
    unsigned long i = 0; /* for busy-waiting */
    volatile unsigned long j; /* to prevent optimisation */

    (void) mbedtls_timing_get_timer( &hires, 1 );

    while( mbedtls_timing_get_timer( &hires, 0 ) < msec )
        i++;

    j = i;
    (void) j;
}